

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

void __thiscall
cmQtAutoGenInitializer::cmQtAutoGenInitializer
          (cmQtAutoGenInitializer *this,cmQtAutoGenGlobalInitializer *globalInitializer,
          cmGeneratorTarget *genTarget,IntegerVersion *qtVersion,bool mocEnabled,bool uicEnabled,
          bool rccEnabled,bool globalAutogenTarget,bool globalAutoRccTarget)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  cmMakefile *pcVar4;
  cmGeneratorTarget *pcVar5;
  cmTarget *this_00;
  bool bVar6;
  cmGlobalGenerator *pcVar7;
  cmLocalGenerator *pcVar8;
  string *psVar9;
  cmValue cVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar11;
  string_view value;
  string_view value_00;
  string local_90;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  UicT *local_40;
  cmFilePathChecksum *local_38;
  
  this->GlobalInitializer = globalInitializer;
  this->GenTarget = genTarget;
  pcVar7 = cmGeneratorTarget::GetGlobalGenerator(genTarget);
  this->GlobalGen = pcVar7;
  pcVar8 = cmGeneratorTarget::GetLocalGenerator(genTarget);
  this->LocalGen = pcVar8;
  pcVar4 = genTarget->Makefile;
  this->Makefile = pcVar4;
  local_38 = &this->PathCheckSum;
  cmFilePathChecksum::cmFilePathChecksum(local_38,pcVar4);
  this->QtVersion = *qtVersion;
  local_48 = &(this->ConfigDefault).field_2;
  this->Verbosity = 0;
  this->MultiConfig = false;
  this->CrossConfig = false;
  this->UseBetterGraph = false;
  this->CMP0071Accept = false;
  this->CMP0071Accept = false;
  this->CMP0071Warn = false;
  this->CMP0100Accept = false;
  this->CMP0100Warn = false;
  (this->ConfigDefault)._M_dataplus._M_p = (pointer)local_48;
  (this->ConfigDefault)._M_string_length = 0;
  (this->ConfigDefault).field_2._M_local_buf[0] = '\0';
  (this->ConfigsList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ConfigsList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ConfigsList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = &(this->TargetsFolder).field_2;
  (this->TargetsFolder)._M_dataplus._M_p = (pointer)local_50;
  (this->TargetsFolder)._M_string_length = 0;
  (this->TargetsFolder).field_2._M_local_buf[0] = '\0';
  (this->Dir).Info._M_dataplus._M_p = (pointer)&(this->Dir).Info.field_2;
  (this->Dir).Info._M_string_length = 0;
  (this->Dir).Info.field_2._M_local_buf[0] = '\0';
  (this->Dir).Build._M_dataplus._M_p = (pointer)&(this->Dir).Build.field_2;
  (this->Dir).Build._M_string_length = 0;
  (this->Dir).Build.field_2._M_local_buf[0] = '\0';
  (this->Dir).RelativeBuild._M_dataplus._M_p = (pointer)&(this->Dir).RelativeBuild.field_2;
  (this->Dir).RelativeBuild._M_string_length = 0;
  (this->Dir).RelativeBuild.field_2._M_local_buf[0] = '\0';
  (this->Dir).Work._M_dataplus._M_p = (pointer)&(this->Dir).Work.field_2;
  (this->Dir).Work._M_string_length = 0;
  (this->Dir).Work.field_2._M_local_buf[0] = '\0';
  (this->Dir).Include.Default._M_dataplus._M_p = (pointer)&(this->Dir).Include.Default.field_2;
  (this->Dir).Include.Default._M_string_length = 0;
  (this->Dir).Include.Default.field_2._M_local_buf[0] = '\0';
  (this->Dir).Include.Config._M_h._M_buckets = &(this->Dir).Include.Config._M_h._M_single_bucket;
  (this->Dir).Include.Config._M_h._M_bucket_count = 1;
  (this->Dir).Include.Config._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->Dir).Include.Config._M_h._M_element_count = 0;
  (this->Dir).Include.Config._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->Dir).Include.Config._M_h._M_rehash_policy._M_next_resize = 0;
  (this->Dir).Include.Config._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->Dir).IncludeGenExp._M_dataplus._M_p = (pointer)&(this->Dir).IncludeGenExp.field_2;
  (this->Dir).IncludeGenExp._M_string_length = 0;
  (this->Dir).IncludeGenExp.field_2._M_local_buf[0] = '\0';
  (this->AutogenTarget).Name._M_dataplus._M_p = (pointer)&(this->AutogenTarget).Name.field_2;
  (this->AutogenTarget).Name._M_string_length = 0;
  (this->AutogenTarget).Name.field_2._M_local_buf[0] = '\0';
  (this->AutogenTarget).GlobalTarget = false;
  (this->AutogenTarget).Parallel = 1;
  (this->AutogenTarget).MaxCommandLineLength = 0xffffffff;
  (this->AutogenTarget).InfoFile._M_dataplus._M_p = (pointer)&(this->AutogenTarget).InfoFile.field_2
  ;
  (this->AutogenTarget).InfoFile._M_string_length = 0;
  (this->AutogenTarget).InfoFile.field_2._M_local_buf[0] = '\0';
  (this->AutogenTarget).SettingsFile.Default._M_dataplus._M_p =
       (pointer)&(this->AutogenTarget).SettingsFile.Default.field_2;
  (this->AutogenTarget).SettingsFile.Default._M_string_length = 0;
  (this->AutogenTarget).SettingsFile.Default.field_2._M_local_buf[0] = '\0';
  (this->AutogenTarget).SettingsFile.Config._M_h._M_buckets =
       &(this->AutogenTarget).SettingsFile.Config._M_h._M_single_bucket;
  (this->AutogenTarget).SettingsFile.Config._M_h._M_bucket_count = 1;
  (this->AutogenTarget).SettingsFile.Config._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->AutogenTarget).SettingsFile.Config._M_h._M_element_count = 0;
  (this->AutogenTarget).SettingsFile.Config._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->AutogenTarget).SettingsFile.Config._M_h._M_rehash_policy._M_next_resize = 0;
  (this->AutogenTarget).SettingsFile.Config._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->AutogenTarget).ParseCacheFile.Default._M_dataplus._M_p =
       (pointer)&(this->AutogenTarget).ParseCacheFile.Default.field_2;
  (this->AutogenTarget).ParseCacheFile.Default._M_string_length = 0;
  (this->AutogenTarget).ParseCacheFile.Default.field_2._M_local_buf[0] = '\0';
  (this->AutogenTarget).ParseCacheFile.Config._M_h._M_buckets =
       &(this->AutogenTarget).ParseCacheFile.Config._M_h._M_single_bucket;
  (this->AutogenTarget).ParseCacheFile.Config._M_h._M_bucket_count = 1;
  (this->AutogenTarget).ParseCacheFile.Config._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->AutogenTarget).ParseCacheFile.Config._M_h._M_element_count = 0;
  (this->AutogenTarget).ParseCacheFile.Config._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header;
  (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->AutogenTarget).DependOrigin = false;
  (this->AutogenTarget).ParseCacheFile.Config._M_h._M_rehash_policy._M_next_resize = 0;
  (this->AutogenTarget).ParseCacheFile.Config._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header;
  (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
  ;
  (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->AutogenTarget).DepFile.Default._M_dataplus._M_p =
       (pointer)&(this->AutogenTarget).DepFile.Default.field_2;
  (this->AutogenTarget).DepFile.Default._M_string_length = 0;
  (this->AutogenTarget).DepFile.Default.field_2._M_local_buf[0] = '\0';
  (this->AutogenTarget).DepFile.Config._M_h._M_buckets =
       &(this->AutogenTarget).DepFile.Config._M_h._M_single_bucket;
  (this->AutogenTarget).DepFile.Config._M_h._M_bucket_count = 1;
  (this->AutogenTarget).DepFile.Config._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->AutogenTarget).DepFile.Config._M_h._M_element_count = 0;
  (this->AutogenTarget).DepFile.Config._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->AutogenTarget).DepFile.Config._M_h._M_rehash_policy._M_next_resize = 0;
  (this->AutogenTarget).DepFile.Config._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->AutogenTarget).DepFileRuleName.Default._M_dataplus._M_p =
       (pointer)&(this->AutogenTarget).DepFileRuleName.Default.field_2;
  (this->AutogenTarget).DepFileRuleName.Default._M_string_length = 0;
  (this->AutogenTarget).DepFileRuleName.Default.field_2._M_local_buf[0] = '\0';
  (this->AutogenTarget).DepFileRuleName.Config._M_h._M_buckets =
       &(this->AutogenTarget).DepFileRuleName.Config._M_h._M_single_bucket;
  (this->AutogenTarget).DepFileRuleName.Config._M_h._M_bucket_count = 1;
  (this->AutogenTarget).DepFileRuleName.Config._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->AutogenTarget).DepFileRuleName.Config._M_h._M_element_count = 0;
  (this->AutogenTarget).DepFileRuleName.Config._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->AutogenTarget).DepFileRuleName.Config._M_h._M_rehash_policy._M_next_resize = 0;
  (this->AutogenTarget).DepFileRuleName.Config._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->AutogenTarget).Headers._M_h._M_buckets =
       &(this->AutogenTarget).Headers._M_h._M_single_bucket;
  (this->AutogenTarget).Headers._M_h._M_bucket_count = 1;
  (this->AutogenTarget).Headers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->AutogenTarget).Headers._M_h._M_element_count = 0;
  (this->AutogenTarget).Headers._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->AutogenTarget).Headers._M_h._M_rehash_policy._M_next_resize = 0;
  (this->AutogenTarget).Headers._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->AutogenTarget).Sources._M_h._M_buckets =
       &(this->AutogenTarget).Sources._M_h._M_single_bucket;
  (this->AutogenTarget).Sources._M_h._M_bucket_count = 1;
  (this->AutogenTarget).Sources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->AutogenTarget).Sources._M_h._M_element_count = 0;
  (this->AutogenTarget).Sources._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->AutogenTarget).CMP0100HeadersWarn.
  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->AutogenTarget).CMP0100HeadersWarn.
  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->AutogenTarget).FilesGenerated.
  super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->AutogenTarget).CMP0100HeadersWarn.
  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->AutogenTarget).FilesGenerated.
  super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->AutogenTarget).FilesGenerated.
  super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->AutogenTarget).Sources._M_h._M_rehash_policy._M_next_resize = 0;
  (this->AutogenTarget).Sources._M_h._M_single_bucket = (__node_base_ptr)0x0;
  MocT::MocT(&this->Moc);
  local_40 = &this->Uic;
  GenVarsT::GenVarsT(&local_40->super_GenVarsT,UIC);
  p_Var1 = &(this->Uic).SkipUi._M_t._M_impl.super__Rb_tree_header;
  (this->Uic).SkipUi._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Uic).SkipUi._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Uic).SkipUi._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Uic).SkipUi._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Uic).SkipUi._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Uic).UiFilesNoOptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Uic).UiFilesNoOptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Uic).UiFilesNoOptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Uic).UiFilesWithOptions.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Uic).UiFilesWithOptions.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Uic).UiFilesWithOptions.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Uic).Options.Default.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Uic).Options.Default.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Uic).Options.Default.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Uic).Options.Config._M_h._M_buckets = &(this->Uic).Options.Config._M_h._M_single_bucket;
  (this->Uic).Options.Config._M_h._M_bucket_count = 1;
  (this->Uic).Options.Config._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->Uic).Options.Config._M_h._M_element_count = 0;
  (this->Uic).Options.Config._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->Uic).Options.Config._M_h._M_rehash_policy._M_next_resize = 0;
  (this->Uic).Options.Config._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->Uic).SearchPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Uic).SearchPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Uic).SearchPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Uic).UiHeaders.
  super__Vector_base<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Uic).UiHeaders.
  super__Vector_base<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Uic).UiHeaders.
  super__Vector_base<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GenVarsT::GenVarsT(&(this->Rcc).super_GenVarsT,RCC);
  (this->Rcc).Qrcs.
  super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Rcc).Qrcs.
  super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Rcc).Qrcs.
  super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->AutogenTarget).GlobalTarget = globalAutogenTarget;
  (this->Moc).super_GenVarsT.Enabled = mocEnabled;
  (this->Uic).super_GenVarsT.Enabled = uicEnabled;
  (this->Rcc).super_GenVarsT.Enabled = rccEnabled;
  (this->Rcc).GlobalTarget = globalAutoRccTarget;
  pcVar4 = this->Makefile;
  paVar2 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_CROSS_CONFIGS","");
  psVar9 = cmMakefile::GetSafeDefinition(pcVar4,&local_90);
  this->CrossConfig = psVar9->_M_string_length != 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = this->GenTarget;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"AUTOGEN_BETTER_GRAPH_MULTI_CONFIG","");
  cVar10 = cmGeneratorTarget::GetProperty(pcVar5,&local_90);
  if ((cVar10.Value != (string *)0x0) &&
     ((cmValue *)(cVar10.Value)->_M_string_length != (cmValue *)0x0)) {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar10.Value)->_M_dataplus)._M_p;
    bVar6 = cmValue::IsNOTFOUND((cmValue *)(cVar10.Value)->_M_string_length,value);
    if (!bVar6) {
      pcVar5 = this->GenTarget;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"AUTOGEN_BETTER_GRAPH_MULTI_CONFIG","");
      cVar10 = cmGeneratorTarget::GetProperty(pcVar5,&local_70);
      if (cVar10.Value == (string *)0x0) {
        bVar6 = false;
      }
      else {
        value_00._M_str = extraout_RDX_00;
        value_00._M_len = (size_t)((cVar10.Value)->_M_dataplus)._M_p;
        bVar6 = cmValue::IsOn((cmValue *)(cVar10.Value)->_M_string_length,value_00);
      }
      this->UseBetterGraph = bVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      goto LAB_002a3da5;
    }
  }
  uVar3 = (this->QtVersion).Major;
  bVar6 = true;
  if (uVar3 < 7) {
    if (uVar3 == 6) {
      bVar6 = 7 < (this->QtVersion).Minor;
    }
    else {
      bVar6 = false;
    }
  }
  this->UseBetterGraph = bVar6;
LAB_002a3da5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  this_00 = this->GenTarget->Target;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"AUTOGEN_BETTER_GRAPH_MULTI_CONFIG","");
  pcVar11 = "OFF";
  if ((ulong)this->UseBetterGraph != 0) {
    pcVar11 = "ON";
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,pcVar11,pcVar11 + ((ulong)this->UseBetterGraph ^ 3));
  cmTarget::SetProperty(this_00,&local_90,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmQtAutoGenInitializer::cmQtAutoGenInitializer(
  cmQtAutoGenGlobalInitializer* globalInitializer,
  cmGeneratorTarget* genTarget, IntegerVersion const& qtVersion,
  bool mocEnabled, bool uicEnabled, bool rccEnabled, bool globalAutogenTarget,
  bool globalAutoRccTarget)
  : GlobalInitializer(globalInitializer)
  , GenTarget(genTarget)
  , GlobalGen(genTarget->GetGlobalGenerator())
  , LocalGen(genTarget->GetLocalGenerator())
  , Makefile(genTarget->Makefile)
  , PathCheckSum(genTarget->Makefile)
  , QtVersion(qtVersion)
{
  this->AutogenTarget.GlobalTarget = globalAutogenTarget;
  this->Moc.Enabled = mocEnabled;
  this->Uic.Enabled = uicEnabled;
  this->Rcc.Enabled = rccEnabled;
  this->Rcc.GlobalTarget = globalAutoRccTarget;
  this->CrossConfig =
    !this->Makefile->GetSafeDefinition("CMAKE_CROSS_CONFIGS").empty();
  this->UseBetterGraph =
    this->GenTarget->GetProperty("AUTOGEN_BETTER_GRAPH_MULTI_CONFIG").IsSet()
    ? this->GenTarget->GetProperty("AUTOGEN_BETTER_GRAPH_MULTI_CONFIG").IsOn()
    : (this->QtVersion >= IntegerVersion(6, 8));
  // AUTOGEN_BETTER_GRAPH_MULTI_CONFIG is set explicitly because it is read by
  // the qt library
  this->GenTarget->Target->SetProperty("AUTOGEN_BETTER_GRAPH_MULTI_CONFIG",
                                       this->UseBetterGraph ? "ON" : "OFF");
}